

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  pointer pbVar1;
  bool bVar2;
  Result RVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  int iVar6;
  long lVar7;
  cmGeneratorTarget *pcVar8;
  string *psVar9;
  ostream *poVar10;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  char *pcVar11;
  long lVar12;
  cmGeneratorTarget *head;
  char *pcVar13;
  size_t i;
  cmGeneratorTarget *target;
  string linkedTargetsContent;
  string propertyName;
  string interfacePropertyName;
  allocator local_1d1;
  string local_1d0;
  char *local_1b0;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  if (1 < ((long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
    std::__cxx11::string::string
              ((string *)&propertyName,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters",
               (allocator *)&linkedTargetsContent);
    reportError(context,(string *)&dagChecker,&propertyName);
    std::__cxx11::string::~string((string *)&propertyName);
    std::__cxx11::string::~string((string *)&dagChecker);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar6 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  target = context->HeadTarget;
  std::__cxx11::string::string
            ((string *)&propertyName,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  lVar12 = lVar7 >> 5;
  if (lVar12 == 1) {
    context->HadHeadSensitiveCondition = true;
    if (target != (cmGeneratorTarget *)0x0) {
      if (lVar7 == 0x40) goto LAB_00456975;
      goto LAB_00456b2d;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
    std::__cxx11::string::string
              ((string *)&linkedTargetsContent,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,(allocator *)&interfacePropertyName);
    reportError(context,(string *)&dagChecker,&linkedTargetsContent);
  }
  else if (lVar12 == 2) {
LAB_00456975:
    if (pbVar1->_M_string_length != 0) {
      std::__cxx11::string::string((string *)&linkedTargetsContent,(string *)pbVar1);
      std::__cxx11::string::_M_assign((string *)&propertyName);
      bVar2 = cmGeneratorExpression::IsValidTargetName(&linkedTargetsContent);
      if (bVar2) {
        bVar2 = std::operator==(&propertyName,"ALIASED_TARGET");
        if (bVar2) {
          bVar2 = cmMakefile::IsAlias(context->LG->Makefile,&linkedTargetsContent);
          if ((bVar2) &&
             (pcVar8 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&linkedTargetsContent)
             , pcVar8 != (cmGeneratorTarget *)0x0)) {
            psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8);
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
          }
          else {
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"",(allocator *)&dagChecker);
          }
        }
        else {
          target = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&linkedTargetsContent);
          if (target != (cmGeneratorTarget *)0x0) {
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&context->AllTargets,&target);
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
            goto LAB_00456b2d;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dagChecker);
          poVar10 = std::operator<<((ostream *)&dagChecker,"Target \"");
          poVar10 = std::operator<<(poVar10,(string *)&linkedTargetsContent);
          std::operator<<(poVar10,"\" not found.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&interfacePropertyName,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&interfacePropertyName,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&interfacePropertyName);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dagChecker);
        }
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
        if (bVar2) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string
                    ((string *)&interfacePropertyName,"Target name not supported.",
                     (allocator *)&local_1d0);
          reportError(context,(string *)&dagChecker,&interfacePropertyName);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::string::string
                    ((string *)&interfacePropertyName,"Target name and property name not supported."
                     ,(allocator *)&local_1d0);
          reportError(context,(string *)&dagChecker,&interfacePropertyName);
        }
        std::__cxx11::string::~string((string *)&interfacePropertyName);
        std::__cxx11::string::~string((string *)&dagChecker);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      std::__cxx11::string::~string((string *)&linkedTargetsContent);
      goto LAB_004574f9;
    }
    if (pbVar1[1]._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                 ,(allocator *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.",
                 (allocator *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
  }
  else {
LAB_00456b2d:
    if (target == context->HeadTarget) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&context->SeenTargetProperties,&propertyName);
    }
    bVar2 = std::operator==(&propertyName,"SOURCES");
    if (bVar2) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->SourceSensitiveTargets,&target);
    }
    if (propertyName._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
      std::__cxx11::string::string
                ((string *)&linkedTargetsContent,
                 "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",
                 (allocator *)&interfacePropertyName);
      reportError(context,(string *)&dagChecker,&linkedTargetsContent);
    }
    else {
      bVar2 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
      if (bVar2) {
        if (target == (cmGeneratorTarget *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x3f6,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        bVar2 = std::operator==(&propertyName,"LINKER_LANGUAGE");
        if (!bVar2) {
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                    (&dagChecker,&context->Backtrace,psVar9,&propertyName,content,dagCheckerParent);
          RVar3 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
          if (RVar3 == SELF_REFERENCE) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                      (&linkedTargetsContent,content);
            cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,&linkedTargetsContent);
LAB_004570e5:
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
LAB_004570ef:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            if (RVar3 == CYCLIC_REFERENCE) goto LAB_004570ef;
            if (RVar3 == ALREADY_SEEN) {
              lVar7 = 1;
              do {
                if (lVar7 == 8) goto LAB_00456e44;
                bVar2 = std::operator==(targetPropertyTransitiveWhitelist[lVar7],&propertyName);
                lVar7 = lVar7 + 1;
              } while (!bVar2);
              goto LAB_004570ef;
            }
LAB_00456e44:
            local_1b0 = cmGeneratorTarget::GetProperty(target,&propertyName);
            if (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0) {
              bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (dagCheckerParent,(char *)0x0);
              if (bVar2) {
                bVar2 = std::operator==("INCLUDE_DIRECTORIES",&propertyName);
                if (((((((bVar2) ||
                        (bVar2 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",&propertyName),
                        bVar2)) ||
                       (bVar2 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",&propertyName), bVar2))
                      || ((bVar2 = std::operator==("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                                   &propertyName), bVar2 ||
                          (bVar2 = std::operator==("COMPILE_DEFINITIONS",&propertyName), bVar2))))
                     || (bVar2 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",&propertyName),
                        bVar2)) ||
                    (((bVar2 = std::operator==("COMPILE_OPTIONS",&propertyName), bVar2 ||
                      (bVar2 = std::operator==("INTERFACE_COMPILE_OPTIONS",&propertyName), bVar2))
                     || ((bVar2 = std::operator==("AUTOUIC_OPTIONS",&propertyName), bVar2 ||
                         (((bVar2 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",&propertyName),
                           bVar2 || (bVar2 = std::operator==("SOURCES",&propertyName), bVar2)) ||
                          (bVar2 = std::operator==("INTERFACE_SOURCES",&propertyName), bVar2))))))))
                   || ((bVar2 = std::operator==("COMPILE_FEATURES",&propertyName), bVar2 ||
                       (bVar2 = std::operator==("INTERFACE_COMPILE_FEATURES",&propertyName), bVar2))
                      )) {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                            (&linkedTargetsContent,content);
                  std::__cxx11::string::string
                            ((string *)&interfacePropertyName,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,(allocator *)&local_1d0);
                  reportError(context,&linkedTargetsContent,&interfacePropertyName);
                  std::__cxx11::string::~string((string *)&interfacePropertyName);
                  goto LAB_004570e5;
                }
                if (local_1b0 == (char *)0x0) goto LAB_004570ef;
              }
              else {
                bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                  (dagCheckerParent);
                if ((((!bVar2) &&
                     (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                        (dagCheckerParent), !bVar2)) &&
                    ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                        (dagCheckerParent), !bVar2 &&
                     (((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions
                                          (dagCheckerParent), !bVar2 &&
                       (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                          (dagCheckerParent), !bVar2)) &&
                      (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent),
                      !bVar2)))))) &&
                   (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                      (dagCheckerParent), !bVar2)) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x434,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
              }
            }
            linkedTargetsContent._M_dataplus._M_p = (pointer)&linkedTargetsContent.field_2;
            linkedTargetsContent._M_string_length = 0;
            linkedTargetsContent.field_2._M_local_buf[0] = '\0';
            interfacePropertyName._M_dataplus._M_p = (pointer)&interfacePropertyName.field_2;
            interfacePropertyName._M_string_length = 0;
            interfacePropertyName.field_2._M_local_buf[0] = '\0';
            bVar2 = std::operator==(&propertyName,"INCLUDE_DIRECTORIES");
            if (bVar2) {
LAB_004571a2:
              std::__cxx11::string::assign((char *)&interfacePropertyName);
              bVar2 = false;
            }
            else {
              bVar2 = std::operator==(&propertyName,"INTERFACE_INCLUDE_DIRECTORIES");
              if (bVar2) {
LAB_004571d5:
                bVar2 = true;
                std::__cxx11::string::assign((char *)&interfacePropertyName);
              }
              else {
                bVar2 = std::operator==(&propertyName,"SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar2) goto LAB_004571d5;
                bVar2 = std::operator==(&propertyName,"COMPILE_DEFINITIONS");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_DEFINITIONS");
                if (bVar2) goto LAB_004571d5;
                bVar2 = std::operator==(&propertyName,"COMPILE_OPTIONS");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_OPTIONS");
                if (bVar2) goto LAB_004571d5;
                bVar2 = std::operator==(&propertyName,"AUTOUIC_OPTIONS");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_AUTOUIC_OPTIONS");
                if (bVar2) goto LAB_004571d5;
                bVar2 = std::operator==(&propertyName,"SOURCES");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_SOURCES");
                if (bVar2) goto LAB_004571d5;
                bVar2 = std::operator==(&propertyName,"COMPILE_FEATURES");
                if (bVar2) goto LAB_004571a2;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_FEATURES");
                if (bVar2) goto LAB_004571d5;
                local_1d0._M_dataplus._M_p = propertyName._M_dataplus._M_p;
                bVar2 = cmHasLiteralPrefix<char_const*,21ul>
                                  ((char **)&local_1d0,(char (*) [21])"COMPILE_DEFINITIONS_");
                if ((bVar2) &&
                   (PVar5 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar5 < NEW)) {
                  std::__cxx11::string::assign((char *)&interfacePropertyName);
                }
                bVar2 = false;
              }
            }
            pcVar8 = target;
            head = context->HeadTarget;
            if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
              head = target;
            }
            if (bVar2) {
              libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                    (target,&context->Config,head,true);
              pcVar8 = head;
              if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                getLinkedTargetsContent<cmLinkItem>
                          (&local_1d0,&libraries->Libraries,target,head,context,&dagChecker,
                           &interfacePropertyName);
LAB_0045728f:
                std::__cxx11::string::operator=
                          ((string *)&linkedTargetsContent,(string *)&local_1d0);
                std::__cxx11::string::~string((string *)&local_1d0);
              }
            }
            else if ((interfacePropertyName._M_string_length != 0) &&
                    (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                              (target,&context->Config),
                    libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
              getLinkedTargetsContent<cmLinkImplItem>
                        (&local_1d0,&libraries_00->Libraries,target,target,context,&dagChecker,
                         &interfacePropertyName);
              goto LAB_0045728f;
            }
            if (local_1b0 == (char *)0x0) {
              bVar2 = cmGeneratorTarget::IsImported(target);
              if ((bVar2) ||
                 (TVar4 = cmGeneratorTarget::GetType(target), TVar4 == INTERFACE_LIBRARY)) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)linkedTargetsContent._M_dataplus._M_p == &linkedTargetsContent.field_2) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                linkedTargetsContent.field_2._M_local_buf[0]);
                  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                       linkedTargetsContent.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = linkedTargetsContent._M_dataplus._M_p
                  ;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                linkedTargetsContent.field_2._M_local_buf[0]);
                }
                __return_storage_ptr__->_M_string_length = linkedTargetsContent._M_string_length;
LAB_004574cd:
                linkedTargetsContent._M_dataplus._M_p = (pointer)&linkedTargetsContent.field_2;
                linkedTargetsContent._M_string_length = 0;
                linkedTargetsContent.field_2._M_local_buf[0] = '\0';
              }
              else {
                psVar9 = &context->Config;
                bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                  (target,&propertyName,psVar9);
                if (bVar2) {
                  context->HadContextSensitiveCondition = true;
                  bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                    (target,&propertyName,psVar9);
                  pcVar13 = "0";
                  if (bVar2) {
                    pcVar13 = "1";
                  }
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                }
                else {
                  bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                    (target,&propertyName,psVar9);
                  if (bVar2) {
                    context->HadContextSensitiveCondition = true;
                    pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                        (target,&propertyName,psVar9);
                    pcVar13 = "";
                    if (pcVar11 != (char *)0x0) {
                      pcVar13 = pcVar11;
                    }
                    std::__cxx11::string::string
                              ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                  }
                  else {
                    bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (target,&propertyName,psVar9);
                    if (bVar2) {
                      context->HadContextSensitiveCondition = true;
                      pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (target,&propertyName,psVar9);
                      pcVar13 = "";
                      if (pcVar11 != (char *)0x0) {
                        pcVar13 = pcVar11;
                      }
                      std::__cxx11::string::string
                                ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                    }
                    else {
                      bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (target,&propertyName,psVar9);
                      if (!bVar2) {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkedTargetsContent._M_dataplus._M_p ==
                            &linkedTargetsContent.field_2) {
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                        linkedTargetsContent.field_2._M_local_buf[0]);
                          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                               linkedTargetsContent.field_2._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               linkedTargetsContent._M_dataplus._M_p;
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(linkedTargetsContent.field_2._M_allocated_capacity._1_7_,
                                        linkedTargetsContent.field_2._M_local_buf[0]);
                        }
                        __return_storage_ptr__->_M_string_length =
                             linkedTargetsContent._M_string_length;
                        goto LAB_004574cd;
                      }
                      context->HadContextSensitiveCondition = true;
                      pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                          (target,&propertyName,psVar9);
                      pcVar13 = "";
                      if (pcVar11 != (char *)0x0) {
                        pcVar13 = pcVar11;
                      }
                      std::__cxx11::string::string
                                ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                    }
                  }
                }
              }
            }
            else {
              bVar2 = cmGeneratorTarget::IsImported(target);
              if ((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0 || bVar2) ||
                 (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                    (dagCheckerParent,(char *)0x0), bVar2)) {
LAB_004572e1:
                if (interfacePropertyName._M_string_length == 0) {
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,local_1b0,(allocator *)&local_1d0);
                }
                else {
                  std::__cxx11::string::string((string *)&local_1d0,local_1b0,&local_1d1);
                  cmGeneratorExpressionNode::EvaluateDependentExpression
                            (__return_storage_ptr__,&local_1d0,context->LG,context,pcVar8,target,
                             &dagChecker);
                  std::__cxx11::string::~string((string *)&local_1d0);
                  if (linkedTargetsContent._M_string_length != 0) {
                    pcVar13 = ";";
                    if (__return_storage_ptr__->_M_string_length == 0) {
                      pcVar13 = "";
                    }
                    std::operator+(&local_1d0,pcVar13,&linkedTargetsContent);
                    std::__cxx11::string::append((string *)__return_storage_ptr__);
                    std::__cxx11::string::~string((string *)&local_1d0);
                  }
                }
              }
              else {
                psVar9 = &context->Config;
                bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                  (target,&propertyName,psVar9);
                if (bVar2) {
                  context->HadContextSensitiveCondition = true;
                  pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      (target,&propertyName,psVar9);
                  pcVar13 = "";
                  if (pcVar11 != (char *)0x0) {
                    pcVar13 = pcVar11;
                  }
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                }
                else {
                  bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                    (target,&propertyName,psVar9);
                  if (!bVar2) goto LAB_004572e1;
                  context->HadContextSensitiveCondition = true;
                  pcVar11 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      (target,&propertyName,psVar9);
                  pcVar13 = "";
                  if (pcVar11 != (char *)0x0) {
                    pcVar13 = pcVar11;
                  }
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,pcVar13,(allocator *)&local_1d0);
                }
              }
            }
            std::__cxx11::string::~string((string *)&interfacePropertyName);
            std::__cxx11::string::~string((string *)&linkedTargetsContent);
          }
          cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
          goto LAB_004574f9;
        }
        bVar2 = cmGeneratorTarget::LinkLanguagePropagatesToDependents(target);
        if ((!bVar2 || dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
           ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               (dagCheckerParent,(char *)0x0), !bVar2 &&
            (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar2)))
           ) {
          cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,target,&context->Config);
          goto LAB_004574f9;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
        std::__cxx11::string::string
                  ((string *)&linkedTargetsContent,
                   "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                   ,(allocator *)&interfacePropertyName);
        reportError(context,(string *)&dagChecker,&linkedTargetsContent);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dagChecker,content);
        std::__cxx11::string::string
                  ((string *)&linkedTargetsContent,"Property name not supported.",
                   (allocator *)&interfacePropertyName);
        reportError(context,(string *)&dagChecker,&linkedTargetsContent);
      }
    }
  }
  std::__cxx11::string::~string((string *)&linkedTargetsContent);
  std::__cxx11::string::~string((string *)&dagChecker);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_004574f9:
  std::__cxx11::string::~string((string *)&propertyName);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* dagCheckerParent) const
    CM_OVERRIDE
  {
    if (parameters.size() != 1 && parameters.size() != 2) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = *parameters.begin();

    if (parameters.size() == 1) {
      context->HadHeadSensitiveCondition = true;
    }
    if (!target && parameters.size() == 1) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
        "It may not be used with add_custom_command or add_custom_target.  "
        "Specify the target to read a property from using the "
        "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
    }

    if (parameters.size() == 2) {
      if (parameters.begin()->empty() && parameters[1].empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name and property name.");
        return std::string();
      }
      if (parameters.begin()->empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name.");
        return std::string();
      }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
        if (!propertyNameValidator.find(propertyName.c_str())) {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
        }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET") {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return "";
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);
    }

    if (target == context->HeadTarget) {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
    }
    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace,
                                               target->GetName(), propertyName,
                                               content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cmArraySize(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    const char* prop = target->GetProperty(propertyName);

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(clang-tidy)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!prop) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName.c_str(),
                                      "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!prop) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }